

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsLinuxELFLinker.cxx
# Opt level: O0

bool __thiscall
cmBinUtilsLinuxELFLinker::ResolveDependency
          (cmBinUtilsLinuxELFLinker *this,string *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *searchPaths,string *path,bool *resolved)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar2;
  ostream *poVar3;
  cmMakefile *this_01;
  string local_320;
  ostringstream local_2f0 [8];
  ostringstream warning;
  cmAlphaNum local_178;
  cmAlphaNum local_148;
  string local_118;
  reference local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *searchPath_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  cmAlphaNum local_a8;
  string local_78;
  reference local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *searchPath;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  bool *resolved_local;
  string *path_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *searchPaths_local;
  string *name_local;
  cmBinUtilsLinuxELFLinker *this_local;
  
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(searchPaths);
  searchPath = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(searchPaths);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&searchPath), bVar1) {
    local_58 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    cmAlphaNum::cmAlphaNum(&local_a8,local_58);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&__range1_1,'/');
    cmStrCat<std::__cxx11::string>(&local_78,&local_a8,(cmAlphaNum *)&__range1_1,name);
    std::__cxx11::string::operator=((string *)path,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    bVar1 = cmsys::SystemTools::PathExists(path);
    if (bVar1) {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      bVar1 = anon_unknown.dwarf_12731e1::FileHasArchitecture(pcVar2,this->Machine);
      if (bVar1) {
        *resolved = true;
        return true;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  this_00 = cmRuntimeDependencyArchive::GetSearchDirectories_abi_cxx11_
                      ((this->super_cmBinUtilsLinker).Archive);
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_00);
  searchPath_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(this_00);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&searchPath_1);
    if (!bVar1) {
      *resolved = false;
      return true;
    }
    local_f8 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1_1);
    cmAlphaNum::cmAlphaNum(&local_148,local_f8);
    cmAlphaNum::cmAlphaNum(&local_178,'/');
    cmStrCat<std::__cxx11::string>(&local_118,&local_148,&local_178,name);
    std::__cxx11::string::operator=((string *)path,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    bVar1 = cmsys::SystemTools::PathExists(path);
    if (bVar1) {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      bVar1 = anon_unknown.dwarf_12731e1::FileHasArchitecture(pcVar2,this->Machine);
      if (bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_2f0);
        poVar3 = std::operator<<((ostream *)local_2f0,"Dependency ");
        poVar3 = std::operator<<(poVar3,(string *)name);
        poVar3 = std::operator<<(poVar3," found in search directory:\n  ");
        poVar3 = std::operator<<(poVar3,(string *)local_f8);
        poVar3 = std::operator<<(poVar3,"\nSee file(GET_RUNTIME_DEPENDENCIES) documentation for ");
        std::operator<<(poVar3,"more information.");
        this_01 = cmRuntimeDependencyArchive::GetMakefile((this->super_cmBinUtilsLinker).Archive);
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(this_01,WARNING,&local_320);
        std::__cxx11::string::~string((string *)&local_320);
        *resolved = true;
        std::__cxx11::ostringstream::~ostringstream(local_2f0);
        return true;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  } while( true );
}

Assistant:

bool cmBinUtilsLinuxELFLinker::ResolveDependency(
  std::string const& name, std::vector<std::string> const& searchPaths,
  std::string& path, bool& resolved)
{
  for (auto const& searchPath : searchPaths) {
    path = cmStrCat(searchPath, '/', name);
    if (cmSystemTools::PathExists(path) &&
        FileHasArchitecture(path.c_str(), this->Machine)) {
      resolved = true;
      return true;
    }
  }

  for (auto const& searchPath : this->Archive->GetSearchDirectories()) {
    path = cmStrCat(searchPath, '/', name);
    if (cmSystemTools::PathExists(path) &&
        FileHasArchitecture(path.c_str(), this->Machine)) {
      std::ostringstream warning;
      warning << "Dependency " << name << " found in search directory:\n  "
              << searchPath
              << "\nSee file(GET_RUNTIME_DEPENDENCIES) documentation for "
              << "more information.";
      this->Archive->GetMakefile()->IssueMessage(MessageType::WARNING,
                                                 warning.str());
      resolved = true;
      return true;
    }
  }

  resolved = false;
  return true;
}